

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  bool bVar1;
  SQInteger SVar2;
  long in_RDX;
  HSQUIRRELVM in_RDI;
  SQInteger unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  SQObjectPtr *arr;
  SQObjectPtr *in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  undefined8 in_stack_fffffffffffffff8;
  SQObjectType type;
  SQRESULT SVar3;
  
  type = (SQObjectType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  SVar2 = sq_gettop(in_RDI);
  if (SVar2 < 1) {
    SQVM::Raise_Error(in_RDI,"not enough params in the stack");
    SVar3 = -1;
  }
  else {
    bVar1 = sq_aux_gettypedarg(in_stack_00000008,unaff_retaddr,type,(SQObjectPtr **)in_RDI);
    if (bVar1) {
      SVar2 = SQArray::Size((SQArray *)0x11667a);
      if (SVar2 < 1) {
        SVar3 = sq_throwerror(in_stack_ffffffffffffffd0,(SQChar *)in_stack_ffffffffffffffc8);
      }
      else {
        if (in_RDX != 0) {
          SQArray::Top((SQArray *)0x1166a0);
          SQVM::Push(in_RDI,in_stack_ffffffffffffffc8);
          in_stack_ffffffffffffffd0 = in_RDI;
        }
        SQArray::Pop((SQArray *)in_stack_ffffffffffffffd0);
        SVar3 = 0;
      }
    }
    else {
      SVar3 = -1;
    }
  }
  return SVar3;
}

Assistant:

SQRESULT sq_arraypop(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 1);
    SQObjectPtr *arr;
    _GETSAFE_OBJ(v, idx, OT_ARRAY,arr);
    if(_array(*arr)->Size() > 0) {
        if(pushval != 0){ v->Push(_array(*arr)->Top()); }
        _array(*arr)->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("empty array"));
}